

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool CoreML::isIOS12NeuralNetworkLayer(NeuralNetworkLayer *layer)

{
  uint32 uVar1;
  bool bVar2;
  UpsampleLayerParams *pUVar3;
  ReorganizeDataLayerParams *pRVar4;
  InnerProductLayerParams *pIVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar1 = layer->_oneof_case_[0];
  uVar7 = (ulong)(uVar1 - 0xbe);
  if (uVar1 - 0xbe < 0x3d) {
    if ((0x30040100400U >> (uVar7 & 0x3f) & 1) == 0) {
      if ((0x1084000000000001U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_0055671f;
      if ((0x600000UL >> (uVar7 & 0x3f) & 1) == 0) goto LAB_00556611;
      goto LAB_00556731;
    }
LAB_005566e2:
    pUVar3 = Specification::NeuralNetworkLayer::upsample(layer);
    if ((pUVar3->linearupsamplemode_ == 0) &&
       (pUVar3 = Specification::NeuralNetworkLayer::upsample(layer),
       (pUVar3->fractionalscalingfactor_).current_size_ < 1)) goto LAB_0055671f;
LAB_0055672d:
    bVar2 = false;
  }
  else {
LAB_00556611:
    uVar7 = (ulong)(uVar1 - 0x78);
    if (uVar1 - 0x78 < 0x3d) {
      if ((0x1080010000000401U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_005566e2;
      if ((0x4200040000000U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_0055671f;
      if (uVar7 == 0x14) {
        pIVar5 = Specification::NeuralNetworkLayer::innerproduct(layer);
        return (bool)(pIVar5->int8dynamicquantize_ ^ 1);
      }
    }
    uVar6 = uVar1 - 0x104;
    if (uVar6 < 0x3d) {
      if ((0x4030040100403U >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
        if ((ulong)uVar6 == 0x3c) goto LAB_005566e2;
        goto LAB_0055662c;
      }
LAB_0055671f:
      pRVar4 = Specification::NeuralNetworkLayer::reorganizedata(layer);
      if (pRVar4->mode_ == 2) goto LAB_0055672d;
    }
    else {
LAB_0055662c:
      if ((uVar1 - 400 < 0x1f) && ((0x40100401U >> (uVar1 - 400 & 0x1f) & 1) != 0))
      goto LAB_0055671f;
      if (uVar1 != 500) {
        if (uVar1 == 0x14a) goto LAB_005566e2;
        if ((uVar1 == 0x154) || (uVar1 == 0x159)) goto LAB_0055671f;
        if (uVar1 != 0x15e) {
          if (uVar1 == 100) {
            return (layer->input_).super_RepeatedPtrFieldBase.current_size_ == 1;
          }
          goto LAB_0055672d;
        }
      }
    }
LAB_00556731:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool CoreML::isIOS12NeuralNetworkLayer(const Specification::NeuralNetworkLayer& layer) {

    // Return True if the NN layer is from the set exposed in iOS 12
    switch (layer.layer_case()) {
        case Specification::NeuralNetworkLayer::LayerCase::kConvolution:
            return (layer.input().size() == 1);
        case Specification::NeuralNetworkLayer::LayerCase::kInnerProduct:
            return !layer.innerproduct().int8dynamicquantize();
        case Specification::NeuralNetworkLayer::LayerCase::kBatchnorm:
        case Specification::NeuralNetworkLayer::LayerCase::kActivation:
        case Specification::NeuralNetworkLayer::LayerCase::kPooling:
        case Specification::NeuralNetworkLayer::LayerCase::kPadding:
        case Specification::NeuralNetworkLayer::LayerCase::kConcat:
        case Specification::NeuralNetworkLayer::LayerCase::kLrn:
        case Specification::NeuralNetworkLayer::LayerCase::kSoftmax:
        case Specification::NeuralNetworkLayer::LayerCase::kSplit:
        case Specification::NeuralNetworkLayer::LayerCase::kAdd:
        case Specification::NeuralNetworkLayer::LayerCase::kMultiply:
        case Specification::NeuralNetworkLayer::LayerCase::kUnary:
        case Specification::NeuralNetworkLayer::LayerCase::kUpsample:
            if (layer.upsample().linearupsamplemode() != Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT) {
                return false;
            }
            if (layer.upsample().fractionalscalingfactor_size() > 0) {
                return false;
            }
        case Specification::NeuralNetworkLayer::LayerCase::kBias:
        case Specification::NeuralNetworkLayer::LayerCase::kL2Normalize:
        case Specification::NeuralNetworkLayer::LayerCase::kReshape:
        case Specification::NeuralNetworkLayer::LayerCase::kFlatten:
        case Specification::NeuralNetworkLayer::LayerCase::kPermute:
        case Specification::NeuralNetworkLayer::LayerCase::kReduce:
        case Specification::NeuralNetworkLayer::LayerCase::kLoadConstant:
        case Specification::NeuralNetworkLayer::LayerCase::kScale:
        case Specification::NeuralNetworkLayer::LayerCase::kSimpleRecurrent:
        case Specification::NeuralNetworkLayer::LayerCase::kGru:
        case Specification::NeuralNetworkLayer::LayerCase::kUniDirectionalLSTM:
        case Specification::NeuralNetworkLayer::LayerCase::kBiDirectionalLSTM:
        case Specification::NeuralNetworkLayer::LayerCase::kCrop:
        case Specification::NeuralNetworkLayer::LayerCase::kAverage:
        case Specification::NeuralNetworkLayer::LayerCase::kMax:
        case Specification::NeuralNetworkLayer::LayerCase::kMin:
        case Specification::NeuralNetworkLayer::LayerCase::kDot:
        case Specification::NeuralNetworkLayer::LayerCase::kMvn:
        case Specification::NeuralNetworkLayer::LayerCase::kEmbedding:
        case Specification::NeuralNetworkLayer::LayerCase::kSequenceRepeat:
        case Specification::NeuralNetworkLayer::LayerCase::kReorganizeData:
            if (layer.reorganizedata().mode() == Specification::ReorganizeDataLayerParams::PIXEL_SHUFFLE) {
                      return false;
            }
        case Specification::NeuralNetworkLayer::LayerCase::kSlice:
        case Specification::NeuralNetworkLayer::LayerCase::kCustom:
        case Specification::NeuralNetworkLayer::kResizeBilinear:
        case Specification::NeuralNetworkLayer::kCropResize:
            return true;
        default:
            return false;
    }
}